

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::MultiAggregationPS::MultiAggregationPS(MultiAggregationPS *this,MultiAggregationPS *old)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  PostStep::PostStep(&this->super_PostStep,&old->super_PostStep);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__MultiAggregationPS_00542b30;
  iVar1 = old->m_i;
  iVar2 = old->m_old_j;
  iVar3 = old->m_old_i;
  this->m_j = old->m_j;
  this->m_i = iVar1;
  this->m_old_j = iVar2;
  this->m_old_i = iVar3;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_upper).m_backend,&(old->m_upper).m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_lower).m_backend,&(old->m_lower).m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_obj).m_backend,&(old->m_obj).m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&(this->m_const).m_backend,&(old->m_const).m_backend);
  this->m_onLhs = old->m_onLhs;
  this->m_eqCons = old->m_eqCons;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&this->m_row,&old->m_row);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&this->m_col,&old->m_col);
  return;
}

Assistant:

MultiAggregationPS(const MultiAggregationPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_i(old.m_i)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_upper(old.m_upper)
         , m_lower(old.m_lower)
         , m_obj(old.m_obj)
         , m_const(old.m_const)
         , m_onLhs(old.m_onLhs)
         , m_eqCons(old.m_eqCons)
         , m_row(old.m_row)
         , m_col(old.m_col)
      {}